

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::fresnel::sgd::eval(sgd *this,float_t zd)

{
  float fVar1;
  _func_int **pp_Var2;
  long lVar3;
  void *pvVar4;
  float *extraout_RDX;
  float *pfVar5;
  long in_RSI;
  _func_int **pp_Var6;
  double dVar7;
  value_type vVar8;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    dVar7 = pow((double)(1.0 - zd),5.0);
    pp_Var2 = *(_func_int ***)(in_RSI + 8);
    (this->super_impl)._vptr_impl = pp_Var2;
    pvVar4 = operator_new((long)pp_Var2 * 4);
    (this->f0)._M_size = (size_t)pvVar4;
    pfVar5 = extraout_RDX;
    if (pp_Var2 != (_func_int **)0x0) {
      lVar3 = *(long *)(in_RSI + 0x10);
      pfVar5 = *(float **)(in_RSI + 0x20);
      pp_Var6 = (_func_int **)0x0;
      do {
        fVar1 = *(float *)(lVar3 + (long)pp_Var6 * 4);
        *(float *)((long)pvVar4 + (long)pp_Var6 * 4) =
             (1.0 - fVar1) * (float)dVar7 + (fVar1 - pfVar5[(long)pp_Var6] * zd);
        pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
      } while (pp_Var2 != pp_Var6);
    }
    vVar8._M_data = pfVar5;
    vVar8._M_size = (size_t)this;
    return vVar8;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x493,"virtual brdf::value_type djb::fresnel::sgd::eval(float_t) const");
}

Assistant:

brdf::value_type sgd::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c = zd;

	return f0 - c * f1 + pow(1 - c, 5) * ((float_t)1 - f0);
}